

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall
rengine::OpenGLRenderer::drawShadowQuad
          (OpenGLRenderer *this,uint offset,GLuint texId,int radius,vec2 renderSize,vec2 textureSize
          ,vec2 step,vec4 color)

{
  float fVar1;
  double dVar2;
  float sigma;
  int radius_local;
  GLuint texId_local;
  uint offset_local;
  OpenGLRenderer *this_local;
  vec4 color_local;
  vec2 step_local;
  vec2 textureSize_local;
  vec2 renderSize_local;
  
  activateShader(this,(Program *)&this->prog_shadow);
  ensureMatrixUpdated(this,UpdateShadowProgram,(Program *)&this->prog_shadow);
  glUniform1i((this->prog_shadow).super_BlurProgram.radius,radius);
  textureSize_local.y = renderSize.y;
  step_local.x = textureSize.x;
  step_local.y = textureSize.y;
  glUniform4f((ulong)renderSize & 0xffffffff,textureSize_local.y,step_local.x,step_local.y,
              (this->prog_shadow).super_BlurProgram.dims);
  fVar1 = (float)radius * 0.3 + 0.8;
  dVar2 = (double)(fVar1 * fVar1) * 2.0;
  glUniform1f(CONCAT44((int)((ulong)dVar2 >> 0x20),(float)dVar2),
              (this->prog_shadow).super_BlurProgram.sigma);
  color_local.w = step.y;
  glUniform2f((ulong)step & 0xffffffff,color_local.w,(this->prog_shadow).super_BlurProgram.step);
  this_local._4_4_ = color.y;
  color_local.x = color.z;
  color_local.y = color.w;
  glUniform4f(color._0_8_ & 0xffffffff,this_local._4_4_,color_local.x,color_local.y,
              (this->prog_shadow).color);
  glVertexAttribPointer(0,2,0x1406,0,0,(ulong)offset << 3);
  glBindTexture(0xde1,texId);
  glDrawArrays(5,0,4);
  return;
}

Assistant:

inline void OpenGLRenderer::drawShadowQuad(unsigned offset, GLuint texId, int radius, vec2 renderSize, vec2 textureSize, vec2 step, vec4 color)
{
    activateShader(&prog_shadow);
    ensureMatrixUpdated(UpdateShadowProgram, &prog_shadow);

    glUniform1i(prog_shadow.radius, radius);
    glUniform4f(prog_shadow.dims, renderSize.x, renderSize.y, textureSize.x, textureSize.y);
    float sigma = 0.3 * radius + 0.8;
    glUniform1f(prog_shadow.sigma, sigma * sigma * 2.0);
    glUniform2f(prog_shadow.step, step.x, step.y);
    glUniform4f(prog_shadow.color, color.x, color.y, color.z, color.w);

    glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, (void *) (offset * sizeof(vec2)));
    glBindTexture(GL_TEXTURE_2D, texId);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
}